

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

bool slang::syntax::SimpleDirectiveSyntax::isKind(SyntaxKind kind)

{
  if ((((0x2b < kind - DelayModeDistributedDirective) ||
       ((0xe800000000fU >> ((ulong)(kind - DelayModeDistributedDirective) & 0x3f) & 1) == 0)) &&
      ((0x12 < kind - ProtectDirective || ((0x40003U >> (kind - ProtectDirective & 0x1f) & 1) == 0))
      )) && (((kind != CellDefineDirective && (kind != NoUnconnectedDriveDirective)) &&
             (kind != UndefineAllDirective)))) {
    return false;
  }
  return true;
}

Assistant:

bool SimpleDirectiveSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::CellDefineDirective:
        case SyntaxKind::DelayModeDistributedDirective:
        case SyntaxKind::DelayModePathDirective:
        case SyntaxKind::DelayModeUnitDirective:
        case SyntaxKind::DelayModeZeroDirective:
        case SyntaxKind::EndCellDefineDirective:
        case SyntaxKind::EndKeywordsDirective:
        case SyntaxKind::EndProtectDirective:
        case SyntaxKind::EndProtectedDirective:
        case SyntaxKind::NoUnconnectedDriveDirective:
        case SyntaxKind::ProtectDirective:
        case SyntaxKind::ProtectedDirective:
        case SyntaxKind::ResetAllDirective:
        case SyntaxKind::UndefineAllDirective:
            return true;
        default:
            return false;
    }
}